

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

void startElementTokenizer(void *ctx,xmlChar *name,xmlChar **atts)

{
  int local_34;
  int i;
  xmlTokenizerConfig *config;
  xmlParserCtxtPtr ctxt;
  xmlChar **atts_local;
  xmlChar *name_local;
  void *ctx_local;
  
  pendingTokenizer(*(xmlTokenizerConfig **)((long)ctx + 0x1a8));
  fprintf((FILE *)SAXdebug,"StartTag\n%s",name);
  if (atts != (xmlChar **)0x0) {
    for (local_34 = 0; atts[local_34] != (xmlChar *)0x0; local_34 = local_34 + 2) {
      fprintf((FILE *)SAXdebug," %s=",atts[local_34]);
      if (atts[local_34 + 1] != (xmlChar *)0x0) {
        fprintf((FILE *)SAXdebug,"%s",atts[local_34 + 1]);
      }
    }
  }
  fprintf((FILE *)SAXdebug,"\n");
  return;
}

Assistant:

static void
startElementTokenizer(void *ctx, const xmlChar *name, const xmlChar **atts) {
    xmlParserCtxtPtr ctxt = ctx;
    xmlTokenizerConfig *config = ctxt->_private;
    int i;

    pendingTokenizer(config);

    fprintf(SAXdebug, "StartTag\n%s", name);
    if (atts != NULL) {
        for (i = 0; atts[i] != NULL; i += 2) {
	    fprintf(SAXdebug, " %s=", atts[i]);
            if (atts[i+1] != NULL)
	        fprintf(SAXdebug, "%s", atts[i+1]);
        }
    }
    fprintf(SAXdebug, "\n");
}